

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool duckdb_je_background_thread_boot0(void)

{
  _Bool _Var1;
  _Bool local_1;
  
  if ((duckdb_je_opt_background_thread) && (_Var1 = pthread_create_fptr_init(), _Var1)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
background_thread_boot0(void) {
	if (!have_background_thread && opt_background_thread) {
		malloc_printf("<jemalloc>: option background_thread currently "
		    "supports pthread only\n");
		return true;
	}
#ifdef JEMALLOC_PTHREAD_CREATE_WRAPPER
	if ((config_lazy_lock || opt_background_thread) &&
	    pthread_create_fptr_init()) {
		return true;
	}
#endif
	return false;
}